

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  QArrayData *pQVar4;
  int *piVar5;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  XmlOutput *pXVar10;
  char *pcVar11;
  int iVar12;
  undefined4 in_register_00000034;
  storage_type *psVar13;
  int iVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QByteArrayView QVar75;
  QByteArrayView QVar76;
  QByteArrayView QVar77;
  QByteArrayView QVar78;
  QByteArrayView QVar79;
  QByteArrayView QVar80;
  QByteArrayView QVar81;
  QByteArrayView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QByteArrayView QVar87;
  QByteArrayView QVar88;
  QByteArrayView QVar89;
  QByteArrayView QVar90;
  QByteArrayView QVar91;
  QByteArrayView QVar92;
  QByteArrayView QVar93;
  QByteArrayView QVar94;
  QByteArrayView QVar95;
  QByteArrayView QVar96;
  QByteArrayView QVar97;
  QByteArrayView QVar98;
  QByteArrayView QVar99;
  QByteArrayView QVar100;
  QByteArrayView QVar101;
  QByteArrayView QVar102;
  QArrayData *local_ef8;
  xml_output local_ee0;
  xml_output local_ea8;
  xml_output local_e70;
  xml_output local_e38;
  xml_output local_e00;
  xml_output local_dc8;
  xml_output local_d90;
  xml_output local_d58;
  xml_output local_d20;
  xml_output local_ce8;
  xml_output local_cb0;
  xml_output local_c78;
  xml_output local_c40;
  xml_output local_c08;
  xml_output local_bd0;
  xml_output local_b98;
  xml_output local_b60;
  xml_output local_b28;
  xml_output local_af0;
  xml_output local_ab8;
  xml_output local_a80;
  xml_output local_a48;
  xml_output local_a10;
  xml_output local_9d8;
  xml_output local_9a0;
  xml_output local_968;
  xml_output local_930;
  xml_output local_8f8;
  xml_output local_8c0;
  xml_output local_888;
  xml_output local_850;
  xml_output local_818;
  xml_output local_7e0;
  xml_output local_7a8;
  xml_output local_770;
  xml_output local_738;
  xml_output local_700;
  xml_output local_6c8;
  xml_output local_690;
  xml_output local_658;
  xml_output local_620;
  xml_output local_5e8;
  xml_output local_5b0;
  xml_output local_578;
  xml_output local_540;
  xml_output local_508;
  xml_output local_4d0;
  xml_output local_498;
  xml_output local_460;
  xml_output local_428;
  xml_output local_3f0;
  xml_output local_3b8;
  xml_output local_380;
  xml_output local_348;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar15.m_data = (storage_type *)0x4;
  QVar15.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar15);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar7 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar7;
  pXVar10 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QVar16.m_data = (storage_type *)0x10;
  QVar16.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar16);
  local_a8.xo_value.d.size = (qsizetype)local_a8.xo_text.d.ptr;
  local_a8.xo_value.d.ptr = (char16_t *)local_a8.xo_text.d.d;
  pQVar6 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
  if (local_a8.xo_text.d.ptr == (char16_t *)0x0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar17.m_data = (storage_type *)0x4;
    QVar17.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar17);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar4;
    local_a8.xo_value.d.d = (Data *)pQVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_a8);
  attrX(&local_e0,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_e0);
  attrX(&local_118,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_118);
  attrX(&local_150,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_150);
  if (*(long *)((long)__buf + 0x60) == 0) {
    local_188.xo_type = tNothing;
    local_188.xo_text.d.d = (Data *)0x0;
    local_188.xo_text.d.ptr = (char16_t *)0x0;
    local_188.xo_text.d.size = 0;
    local_188.xo_value.d.d = (Data *)0x0;
    local_188.xo_value.d.ptr = (char16_t *)0x0;
    local_188.xo_value.d.size = 0;
  }
  else {
    QVar18.m_data = (storage_type *)0x18;
    QVar18.m_size = (qsizetype)&local_188;
    QString::fromUtf8(QVar18);
    local_188.xo_text.d.size = (qsizetype)local_188.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_188._4_4_,local_188.xo_type);
    local_188.xo_type = tAttribute;
    local_188.xo_text.d.ptr = (char16_t *)local_188.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_188.xo_value.d.d = *(Data **)((long)__buf + 0x50);
    local_188.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x58);
    local_188.xo_value.d.size = *(qsizetype *)((long)__buf + 0x60);
    if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_188.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_188);
  iVar2 = *(int *)((long)__buf + 0x68);
  if (iVar2 == 0) {
    local_1c0.xo_type = tNothing;
    local_1c0.xo_text.d.d = (Data *)0x0;
    local_1c0.xo_text.d.ptr = (char16_t *)0x0;
    local_1c0.xo_text.d.size = 0;
    local_1c0.xo_value.d.d = (Data *)0x0;
    local_1c0.xo_value.d.ptr = (char16_t *)0x0;
    local_1c0.xo_value.d.size = 0;
  }
  else {
    QVar19.m_data = (storage_type *)0xf;
    QVar19.m_size = (qsizetype)&local_1c0;
    QString::fromUtf8(QVar19);
    pcVar9 = local_1c0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    QString::number((int)&local_1f8,iVar2);
    local_1c0.xo_type = tAttribute;
    local_1c0.xo_text.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
    local_1c0.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1c0.xo_value.d.d = (Data *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    local_1c0.xo_value.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    local_1c0.xo_value.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
    local_1c0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_1c0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_1c0);
  iVar2 = *(int *)((long)__buf + 0x6c);
  if (iVar2 == 0) {
    local_1f8.xo_type = tNothing;
    local_1f8.xo_text.d.d = (Data *)0x0;
    local_1f8.xo_text.d.ptr = (char16_t *)0x0;
    local_1f8.xo_text.d.size = 0;
    local_1f8.xo_value.d.d = (Data *)0x0;
    local_1f8.xo_value.d.ptr = (char16_t *)0x0;
    local_1f8.xo_value.d.size = 0;
  }
  else {
    QVar20.m_data = (storage_type *)0x12;
    QVar20.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar20);
    pcVar9 = local_1f8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    QString::number((int)&local_230,iVar2);
    local_1f8.xo_type = tAttribute;
    local_1f8.xo_text.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    local_1f8.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f8.xo_value.d.d = (Data *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_1f8.xo_value.d.ptr = (char16_t *)local_230.xo_text.d.d;
    local_1f8.xo_value.d.size = (qsizetype)local_230.xo_text.d.ptr;
    local_1f8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_1f8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_230._4_4_,local_230.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_1f8);
  iVar2 = *(int *)((long)__buf + 0x70);
  if (iVar2 == 0) {
    local_230.xo_type = tNothing;
    local_230.xo_text.d.d = (Data *)0x0;
    local_230.xo_text.d.ptr = (char16_t *)0x0;
    local_230.xo_text.d.size = 0;
    local_230.xo_value.d.d = (Data *)0x0;
    local_230.xo_value.d.ptr = (char16_t *)0x0;
    local_230.xo_value.d.size = 0;
  }
  else {
    QVar21.m_data = (storage_type *)0x11;
    QVar21.m_size = (qsizetype)&local_230;
    QString::fromUtf8(QVar21);
    pcVar9 = local_230.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type);
    QString::number((int)&local_268,iVar2);
    local_230.xo_type = tAttribute;
    local_230.xo_text.d.ptr = (char16_t *)local_230.xo_text.d.d;
    local_230.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_230.xo_value.d.d = (Data *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_230.xo_value.d.ptr = (char16_t *)local_268.xo_text.d.d;
    local_230.xo_value.d.size = (qsizetype)local_268.xo_text.d.ptr;
    local_230.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_230.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_230.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_230.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_268._4_4_,local_268.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_230);
  if (*(long *)((long)__buf + 0x88) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar22.m_data = (storage_type *)0x15;
    QVar22.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar22);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tAttribute;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0x78);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x80);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 0x88);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_268);
  iVar2 = *(int *)((long)__buf + 0x90);
  if (iVar2 == -1) {
    local_2a0.xo_type = tNothing;
    local_2a0.xo_text.d.d = (Data *)0x0;
    local_2a0.xo_text.d.ptr = (char16_t *)0x0;
    local_2a0.xo_text.d.size = 0;
    local_2a0.xo_value.d.d = (Data *)0x0;
    local_2a0.xo_value.d.ptr = (char16_t *)0x0;
    local_2a0.xo_value.d.size = 0;
  }
  else {
    QVar23.m_data = (storage_type *)0x13;
    QVar23.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar23);
    local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    pDVar8 = local_2a0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar24.m_data = psVar13;
    QVar24.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar24);
    local_2a0.xo_value.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    local_2a0.xo_value.d.d = (Data *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    local_2a0.xo_type = tAttribute;
    local_2a0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2a0.xo_value.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
    local_2a0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_2a0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_2a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_2a0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_2a0);
  iVar2 = *(int *)((long)__buf + 0x94);
  if (iVar2 == -1) {
    local_2d8.xo_type = tNothing;
    local_2d8.xo_text.d.d = (Data *)0x0;
    local_2d8.xo_text.d.ptr = (char16_t *)0x0;
    local_2d8.xo_text.d.size = 0;
    local_2d8.xo_value.d.d = (Data *)0x0;
    local_2d8.xo_value.d.ptr = (char16_t *)0x0;
    local_2d8.xo_value.d.size = 0;
  }
  else {
    QVar25.m_data = (storage_type *)0x11;
    QVar25.m_size = (qsizetype)&local_2d8;
    QString::fromUtf8(QVar25);
    pcVar9 = local_2d8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_2d8._4_4_,local_2d8.xo_type);
    QString::number((int)&local_310,iVar2);
    local_2d8.xo_type = tAttribute;
    local_2d8.xo_text.d.ptr = (char16_t *)local_2d8.xo_text.d.d;
    local_2d8.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2d8.xo_value.d.d = (Data *)CONCAT44(local_310._4_4_,local_310.xo_type);
    local_2d8.xo_value.d.ptr = (char16_t *)local_310.xo_text.d.d;
    local_2d8.xo_value.d.size = (qsizetype)local_310.xo_text.d.ptr;
    local_2d8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_2d8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_2d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_310._4_4_,local_310.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_2d8);
  iVar2 = *(int *)((long)__buf + 0x98);
  if (iVar2 == 0) {
    local_310.xo_type = tNothing;
    local_310.xo_text.d.d = (Data *)0x0;
    local_310.xo_text.d.ptr = (char16_t *)0x0;
    local_310.xo_text.d.size = 0;
    local_310.xo_value.d.d = (Data *)0x0;
    local_310.xo_value.d.ptr = (char16_t *)0x0;
    local_310.xo_value.d.size = 0;
  }
  else {
    QVar26.m_data = (storage_type *)0x9;
    QVar26.m_size = (qsizetype)&local_310;
    QString::fromUtf8(QVar26);
    pcVar9 = local_310.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type);
    QString::number((int)&local_348,iVar2);
    local_310.xo_type = tAttribute;
    local_310.xo_text.d.ptr = (char16_t *)local_310.xo_text.d.d;
    local_310.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_310.xo_value.d.d = (Data *)CONCAT44(local_348._4_4_,local_348.xo_type);
    local_310.xo_value.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_310.xo_value.d.size = (qsizetype)local_348.xo_text.d.ptr;
    local_310.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_310.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_348._4_4_,local_348.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_310);
  iVar2 = *(int *)((long)__buf + 0x9c);
  if (iVar2 == -1) {
    local_348.xo_type = tNothing;
    local_348.xo_text.d.d = (Data *)0x0;
    local_348.xo_text.d.ptr = (char16_t *)0x0;
    local_348.xo_text.d.size = 0;
    local_348.xo_value.d.d = (Data *)0x0;
    local_348.xo_value.d.ptr = (char16_t *)0x0;
    local_348.xo_value.d.size = 0;
  }
  else {
    QVar27.m_data = (storage_type *)0x10;
    QVar27.m_size = (qsizetype)&local_348;
    QString::fromUtf8(QVar27);
    pcVar9 = local_348.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type);
    QString::number((int)&local_380,iVar2);
    local_348.xo_type = tAttribute;
    local_348.xo_text.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_348.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_348.xo_value.d.d = (Data *)CONCAT44(local_380._4_4_,local_380.xo_type);
    local_348.xo_value.d.ptr = (char16_t *)local_380.xo_text.d.d;
    local_348.xo_value.d.size = (qsizetype)local_380.xo_text.d.ptr;
    local_348.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_348.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_380._4_4_,local_380.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_348);
  iVar2 = *(int *)((long)__buf + 0xa4);
  if (iVar2 == -1) {
    local_380.xo_type = tNothing;
    local_380.xo_text.d.d = (Data *)0x0;
    local_380.xo_text.d.ptr = (char16_t *)0x0;
    local_380.xo_text.d.size = 0;
    local_380.xo_value.d.d = (Data *)0x0;
    local_380.xo_value.d.ptr = (char16_t *)0x0;
    local_380.xo_value.d.size = 0;
  }
  else {
    QVar28.m_data = (storage_type *)0xb;
    QVar28.m_size = (qsizetype)&local_380;
    QString::fromUtf8(QVar28);
    local_380.xo_text.d.size = (qsizetype)local_380.xo_text.d.ptr;
    pDVar8 = local_380.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar29.m_data = psVar13;
    QVar29.m_size = (qsizetype)&local_380;
    QString::fromUtf8(QVar29);
    local_380.xo_value.d.size = (qsizetype)local_380.xo_text.d.ptr;
    local_380.xo_value.d.d = (Data *)CONCAT44(local_380._4_4_,local_380.xo_type);
    local_380.xo_type = tAttribute;
    local_380.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_380.xo_value.d.ptr = (char16_t *)local_380.xo_text.d.d;
    local_380.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_380.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_380.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_380);
  iVar2 = *(int *)((long)__buf + 0xa8);
  if (iVar2 == -1) {
    local_3b8.xo_type = tNothing;
    local_3b8.xo_text.d.d = (Data *)0x0;
    local_3b8.xo_text.d.ptr = (char16_t *)0x0;
    local_3b8.xo_text.d.size = 0;
    local_3b8.xo_value.d.d = (Data *)0x0;
    local_3b8.xo_value.d.ptr = (char16_t *)0x0;
    local_3b8.xo_value.d.size = 0;
  }
  else {
    QVar30.m_data = (storage_type *)0x16;
    QVar30.m_size = (qsizetype)&local_3b8;
    QString::fromUtf8(QVar30);
    pcVar9 = local_3b8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
    QString::number((int)&local_3f0,iVar2);
    local_3b8.xo_type = tAttribute;
    local_3b8.xo_text.d.ptr = (char16_t *)local_3b8.xo_text.d.d;
    local_3b8.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3b8.xo_value.d.d = (Data *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type);
    local_3b8.xo_value.d.ptr = (char16_t *)local_3f0.xo_text.d.d;
    local_3b8.xo_value.d.size = (qsizetype)local_3f0.xo_text.d.ptr;
    local_3b8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_3b8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_3b8);
  iVar2 = *(int *)((long)__buf + 0xb0);
  if (iVar2 == -1) {
    local_3f0.xo_type = tNothing;
    local_3f0.xo_text.d.d = (Data *)0x0;
    local_3f0.xo_text.d.ptr = (char16_t *)0x0;
    local_3f0.xo_text.d.size = 0;
    local_3f0.xo_value.d.d = (Data *)0x0;
    local_3f0.xo_value.d.ptr = (char16_t *)0x0;
    local_3f0.xo_value.d.size = 0;
  }
  else {
    QVar31.m_data = (storage_type *)0x1e;
    QVar31.m_size = (qsizetype)&local_3f0;
    QString::fromUtf8(QVar31);
    local_3f0.xo_text.d.size = (qsizetype)local_3f0.xo_text.d.ptr;
    pDVar8 = local_3f0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar32.m_data = psVar13;
    QVar32.m_size = (qsizetype)&local_3f0;
    QString::fromUtf8(QVar32);
    local_3f0.xo_value.d.size = (qsizetype)local_3f0.xo_text.d.ptr;
    local_3f0.xo_value.d.d = (Data *)CONCAT44(local_3f0._4_4_,local_3f0.xo_type);
    local_3f0.xo_type = tAttribute;
    local_3f0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3f0.xo_value.d.ptr = (char16_t *)local_3f0.xo_text.d.d;
    local_3f0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_3f0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3f0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3f0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_3f0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3f0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_3f0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_3f0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_3f0);
  iVar2 = *(int *)((long)__buf + 0xb4);
  if (iVar2 == -1) {
    local_428.xo_type = tNothing;
    local_428.xo_text.d.d = (Data *)0x0;
    local_428.xo_text.d.ptr = (char16_t *)0x0;
    local_428.xo_text.d.size = 0;
    local_428.xo_value.d.d = (Data *)0x0;
    local_428.xo_value.d.ptr = (char16_t *)0x0;
    local_428.xo_value.d.size = 0;
  }
  else {
    QVar33.m_data = (storage_type *)0x19;
    QVar33.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar33);
    local_428.xo_text.d.size = (qsizetype)local_428.xo_text.d.ptr;
    pDVar8 = local_428.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_428._4_4_,local_428.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar34.m_data = psVar13;
    QVar34.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar34);
    local_428.xo_value.d.size = (qsizetype)local_428.xo_text.d.ptr;
    local_428.xo_value.d.d = (Data *)CONCAT44(local_428._4_4_,local_428.xo_type);
    local_428.xo_type = tAttribute;
    local_428.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_428.xo_value.d.ptr = (char16_t *)local_428.xo_text.d.d;
    local_428.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_428.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_428.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_428.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_428.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_428.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_428.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_428.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_428);
  attrX(&local_460,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_460);
  iVar2 = *(int *)((long)__buf + 0xd0);
  if (iVar2 == 0) {
    local_498.xo_type = tNothing;
    local_498.xo_text.d.d = (Data *)0x0;
    local_498.xo_text.d.ptr = (char16_t *)0x0;
    local_498.xo_text.d.size = 0;
    local_498.xo_value.d.d = (Data *)0x0;
    local_498.xo_value.d.ptr = (char16_t *)0x0;
    local_498.xo_value.d.size = 0;
  }
  else {
    QVar35.m_data = (storage_type *)0x1c;
    QVar35.m_size = (qsizetype)&local_498;
    QString::fromUtf8(QVar35);
    pcVar9 = local_498.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_498._4_4_,local_498.xo_type);
    QString::number((int)&local_4d0,iVar2);
    local_498.xo_type = tAttribute;
    local_498.xo_text.d.ptr = (char16_t *)local_498.xo_text.d.d;
    local_498.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_498.xo_value.d.d = (Data *)CONCAT44(local_4d0._4_4_,local_4d0.xo_type);
    local_498.xo_value.d.ptr = (char16_t *)local_4d0.xo_text.d.d;
    local_498.xo_value.d.size = (qsizetype)local_4d0.xo_text.d.ptr;
    local_498.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_498.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_498.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_498.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_4d0._4_4_,local_4d0.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_4d0._4_4_,local_4d0.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_498);
  iVar2 = *(int *)((long)__buf + 0xd4);
  if (iVar2 == -1) {
    local_4d0.xo_type = tNothing;
    local_4d0.xo_text.d.d = (Data *)0x0;
    local_4d0.xo_text.d.ptr = (char16_t *)0x0;
    local_4d0.xo_text.d.size = 0;
    local_4d0.xo_value.d.d = (Data *)0x0;
    local_4d0.xo_value.d.ptr = (char16_t *)0x0;
    local_4d0.xo_value.d.size = 0;
  }
  else {
    QVar36.m_data = (storage_type *)0x1c;
    QVar36.m_size = (qsizetype)&local_4d0;
    QString::fromUtf8(QVar36);
    local_4d0.xo_text.d.size = (qsizetype)local_4d0.xo_text.d.ptr;
    pDVar8 = local_4d0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_4d0._4_4_,local_4d0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar37.m_data = psVar13;
    QVar37.m_size = (qsizetype)&local_4d0;
    QString::fromUtf8(QVar37);
    local_4d0.xo_value.d.size = (qsizetype)local_4d0.xo_text.d.ptr;
    local_4d0.xo_value.d.d = (Data *)CONCAT44(local_4d0._4_4_,local_4d0.xo_type);
    local_4d0.xo_type = tAttribute;
    local_4d0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4d0.xo_value.d.ptr = (char16_t *)local_4d0.xo_text.d.d;
    local_4d0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_4d0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_4d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_4d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_4d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_4d0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_4d0);
  iVar2 = *(int *)((long)__buf + 0xd8);
  if (iVar2 == -1) {
    local_508.xo_type = tNothing;
    local_508.xo_text.d.d = (Data *)0x0;
    local_508.xo_text.d.ptr = (char16_t *)0x0;
    local_508.xo_text.d.size = 0;
    local_508.xo_value.d.d = (Data *)0x0;
    local_508.xo_value.d.ptr = (char16_t *)0x0;
    local_508.xo_value.d.size = 0;
  }
  else {
    QVar38.m_data = &DAT_0000001a;
    QVar38.m_size = (qsizetype)&local_508;
    QString::fromUtf8(QVar38);
    local_508.xo_text.d.size = (qsizetype)local_508.xo_text.d.ptr;
    pDVar8 = local_508.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_508._4_4_,local_508.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar39.m_data = psVar13;
    QVar39.m_size = (qsizetype)&local_508;
    QString::fromUtf8(QVar39);
    local_508.xo_value.d.size = (qsizetype)local_508.xo_text.d.ptr;
    local_508.xo_value.d.d = (Data *)CONCAT44(local_508._4_4_,local_508.xo_type);
    local_508.xo_type = tAttribute;
    local_508.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_508.xo_value.d.ptr = (char16_t *)local_508.xo_text.d.d;
    local_508.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_508.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_508.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_508.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_508.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_508.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_508.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_508.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_508);
  iVar2 = *(int *)((long)__buf + 0xdc);
  if (iVar2 == -1) {
    local_540.xo_type = tNothing;
    local_540.xo_text.d.d = (Data *)0x0;
    local_540.xo_text.d.ptr = (char16_t *)0x0;
    local_540.xo_text.d.size = 0;
    local_540.xo_value.d.d = (Data *)0x0;
    local_540.xo_value.d.ptr = (char16_t *)0x0;
    local_540.xo_value.d.size = 0;
  }
  else {
    QVar40.m_data = (storage_type *)0x18;
    QVar40.m_size = (qsizetype)&local_540;
    QString::fromUtf8(QVar40);
    local_540.xo_text.d.size = (qsizetype)local_540.xo_text.d.ptr;
    pDVar8 = local_540.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_540._4_4_,local_540.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar41.m_data = psVar13;
    QVar41.m_size = (qsizetype)&local_540;
    QString::fromUtf8(QVar41);
    local_540.xo_value.d.size = (qsizetype)local_540.xo_text.d.ptr;
    local_540.xo_value.d.d = (Data *)CONCAT44(local_540._4_4_,local_540.xo_type);
    local_540.xo_type = tAttribute;
    local_540.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_540.xo_value.d.ptr = (char16_t *)local_540.xo_text.d.d;
    local_540.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_540.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_540.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_540.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_540.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_540.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_540.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_540.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_540);
  xformExceptionHandlingNET2005
            (&local_578,*(exceptionHandling *)((long)__buf + 0xe0),
             *(DotNET *)(*(long *)((long)__buf + 0x318) + 4));
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_578);
  iVar2 = *(int *)((long)__buf + 0xe4);
  if (iVar2 == -1) {
    local_5b0.xo_type = tNothing;
    local_5b0.xo_text.d.d = (Data *)0x0;
    local_5b0.xo_text.d.ptr = (char16_t *)0x0;
    local_5b0.xo_text.d.size = 0;
    local_5b0.xo_value.d.d = (Data *)0x0;
    local_5b0.xo_value.d.ptr = (char16_t *)0x0;
    local_5b0.xo_value.d.size = 0;
  }
  else {
    QVar42.m_data = (storage_type *)0x16;
    QVar42.m_size = (qsizetype)&local_5b0;
    QString::fromUtf8(QVar42);
    local_5b0.xo_text.d.size = (qsizetype)local_5b0.xo_text.d.ptr;
    pDVar8 = local_5b0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_5b0._4_4_,local_5b0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar43.m_data = psVar13;
    QVar43.m_size = (qsizetype)&local_5b0;
    QString::fromUtf8(QVar43);
    local_5b0.xo_value.d.size = (qsizetype)local_5b0.xo_text.d.ptr;
    local_5b0.xo_value.d.d = (Data *)CONCAT44(local_5b0._4_4_,local_5b0.xo_type);
    local_5b0.xo_type = tAttribute;
    local_5b0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_5b0.xo_value.d.ptr = (char16_t *)local_5b0.xo_text.d.d;
    local_5b0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_5b0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_5b0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5b0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_5b0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5b0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_5b0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_5b0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_5b0);
  iVar2 = *(int *)((long)__buf + 0xe8);
  if (iVar2 == 0) {
    local_5e8.xo_type = tNothing;
    local_5e8.xo_text.d.d = (Data *)0x0;
    local_5e8.xo_text.d.ptr = (char16_t *)0x0;
    local_5e8.xo_text.d.size = 0;
    local_5e8.xo_value.d.d = (Data *)0x0;
    local_5e8.xo_value.d.ptr = (char16_t *)0x0;
    local_5e8.xo_value.d.size = 0;
  }
  else {
    QVar44.m_data = (storage_type *)0x10;
    QVar44.m_size = (qsizetype)&local_5e8;
    QString::fromUtf8(QVar44);
    pcVar9 = local_5e8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_5e8._4_4_,local_5e8.xo_type);
    QString::number((int)&local_620,iVar2);
    local_5e8.xo_type = tAttribute;
    local_5e8.xo_text.d.ptr = (char16_t *)local_5e8.xo_text.d.d;
    local_5e8.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_5e8.xo_value.d.d = (Data *)CONCAT44(local_620._4_4_,local_620.xo_type);
    local_5e8.xo_value.d.ptr = (char16_t *)local_620.xo_text.d.d;
    local_5e8.xo_value.d.size = (qsizetype)local_620.xo_text.d.ptr;
    local_5e8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_5e8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_5e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_620._4_4_,local_620.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_620._4_4_,local_620.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_5e8);
  iVar2 = *(int *)((long)__buf + 0xec);
  if (iVar2 == -1) {
    local_620.xo_type = tNothing;
    local_620.xo_text.d.d = (Data *)0x0;
    local_620.xo_text.d.ptr = (char16_t *)0x0;
    local_620.xo_text.d.size = 0;
    local_620.xo_value.d.d = (Data *)0x0;
    local_620.xo_value.d.ptr = (char16_t *)0x0;
    local_620.xo_value.d.size = 0;
  }
  else {
    QVar45.m_data = (storage_type *)0x12;
    QVar45.m_size = (qsizetype)&local_620;
    QString::fromUtf8(QVar45);
    pcVar9 = local_620.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_620._4_4_,local_620.xo_type);
    QString::number((int)&local_658,iVar2);
    local_620.xo_type = tAttribute;
    local_620.xo_text.d.ptr = (char16_t *)local_620.xo_text.d.d;
    local_620.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_620.xo_value.d.d = (Data *)CONCAT44(local_658._4_4_,local_658.xo_type);
    local_620.xo_value.d.ptr = (char16_t *)local_658.xo_text.d.d;
    local_620.xo_value.d.size = (qsizetype)local_658.xo_text.d.ptr;
    local_620.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_620.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_620.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_620.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_658._4_4_,local_658.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_658._4_4_,local_658.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_620);
  iVar2 = *(int *)((long)__buf + 0xf0);
  if (iVar2 == -1) {
    local_658.xo_type = tNothing;
    local_658.xo_text.d.d = (Data *)0x0;
    local_658.xo_text.d.ptr = (char16_t *)0x0;
    local_658.xo_text.d.size = 0;
    local_658.xo_value.d.d = (Data *)0x0;
    local_658.xo_value.d.ptr = (char16_t *)0x0;
    local_658.xo_value.d.size = 0;
  }
  else {
    QVar46.m_data = (storage_type *)0x17;
    QVar46.m_size = (qsizetype)&local_658;
    QString::fromUtf8(QVar46);
    local_658.xo_text.d.size = (qsizetype)local_658.xo_text.d.ptr;
    pDVar8 = local_658.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_658._4_4_,local_658.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar47.m_data = psVar13;
    QVar47.m_size = (qsizetype)&local_658;
    QString::fromUtf8(QVar47);
    local_658.xo_value.d.size = (qsizetype)local_658.xo_text.d.ptr;
    local_658.xo_value.d.d = (Data *)CONCAT44(local_658._4_4_,local_658.xo_type);
    local_658.xo_type = tAttribute;
    local_658.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_658.xo_value.d.ptr = (char16_t *)local_658.xo_text.d.d;
    local_658.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_658.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_658.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_658.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_658.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_658.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_658.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_658.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_658);
  iVar2 = *(int *)((long)__buf + 0xf4);
  if (iVar2 == -1) {
    local_690.xo_type = tNothing;
    local_690.xo_text.d.d = (Data *)0x0;
    local_690.xo_text.d.ptr = (char16_t *)0x0;
    local_690.xo_text.d.size = 0;
    local_690.xo_value.d.d = (Data *)0x0;
    local_690.xo_value.d.ptr = (char16_t *)0x0;
    local_690.xo_value.d.size = 0;
  }
  else {
    QVar48.m_data = (storage_type *)0x1e;
    QVar48.m_size = (qsizetype)&local_690;
    QString::fromUtf8(QVar48);
    local_690.xo_text.d.size = (qsizetype)local_690.xo_text.d.ptr;
    pDVar8 = local_690.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_690._4_4_,local_690.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar49.m_data = psVar13;
    QVar49.m_size = (qsizetype)&local_690;
    QString::fromUtf8(QVar49);
    local_690.xo_value.d.size = (qsizetype)local_690.xo_text.d.ptr;
    local_690.xo_value.d.d = (Data *)CONCAT44(local_690._4_4_,local_690.xo_type);
    local_690.xo_type = tAttribute;
    local_690.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_690.xo_value.d.ptr = (char16_t *)local_690.xo_text.d.d;
    local_690.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_690.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_690.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_690.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_690.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_690.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_690.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_690.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_690);
  attrX(&local_6c8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_6c8);
  attrX(&local_700,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_700);
  iVar2 = *(int *)((long)__buf + 0x128);
  if (iVar2 == -1) {
    local_738.xo_type = tNothing;
    local_738.xo_text.d.d = (Data *)0x0;
    local_738.xo_text.d.ptr = (char16_t *)0x0;
    local_738.xo_text.d.size = 0;
    local_738.xo_value.d.d = (Data *)0x0;
    local_738.xo_value.d.ptr = (char16_t *)0x0;
    local_738.xo_value.d.size = 0;
  }
  else {
    QVar50.m_data = (storage_type *)0x18;
    QVar50.m_size = (qsizetype)&local_738;
    QString::fromUtf8(QVar50);
    pcVar9 = local_738.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_738._4_4_,local_738.xo_type);
    QString::number((int)&local_770,iVar2);
    local_738.xo_type = tAttribute;
    local_738.xo_text.d.ptr = (char16_t *)local_738.xo_text.d.d;
    local_738.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_738.xo_value.d.d = (Data *)CONCAT44(local_770._4_4_,local_770.xo_type);
    local_738.xo_value.d.ptr = (char16_t *)local_770.xo_text.d.d;
    local_738.xo_value.d.size = (qsizetype)local_770.xo_text.d.ptr;
    local_738.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_738.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_738.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_738.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_770._4_4_,local_770.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_770._4_4_,local_770.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_738);
  iVar2 = *(int *)((long)__buf + 0x130);
  if (iVar2 == -1) {
    local_770.xo_type = tNothing;
    local_770.xo_text.d.d = (Data *)0x0;
    local_770.xo_text.d.ptr = (char16_t *)0x0;
    local_770.xo_text.d.size = 0;
    local_770.xo_value.d.d = (Data *)0x0;
    local_770.xo_value.d.ptr = (char16_t *)0x0;
    local_770.xo_value.d.size = 0;
  }
  else {
    QVar51.m_data = (storage_type *)0x13;
    QVar51.m_size = (qsizetype)&local_770;
    QString::fromUtf8(QVar51);
    local_770.xo_text.d.size = (qsizetype)local_770.xo_text.d.ptr;
    pDVar8 = local_770.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_770._4_4_,local_770.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar52.m_data = psVar13;
    QVar52.m_size = (qsizetype)&local_770;
    QString::fromUtf8(QVar52);
    local_770.xo_value.d.size = (qsizetype)local_770.xo_text.d.ptr;
    local_770.xo_value.d.d = (Data *)CONCAT44(local_770._4_4_,local_770.xo_type);
    local_770.xo_type = tAttribute;
    local_770.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_770.xo_value.d.ptr = (char16_t *)local_770.xo_text.d.d;
    local_770.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_770.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_770.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_770.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_770.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_770.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_770.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_770.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_770);
  iVar2 = *(int *)((long)__buf + 0x134);
  if (iVar2 == -1) {
    local_7a8.xo_type = tNothing;
    local_7a8.xo_text.d.d = (Data *)0x0;
    local_7a8.xo_text.d.ptr = (char16_t *)0x0;
    local_7a8.xo_text.d.size = 0;
    local_7a8.xo_value.d.d = (Data *)0x0;
    local_7a8.xo_value.d.ptr = (char16_t *)0x0;
    local_7a8.xo_value.d.size = 0;
  }
  else {
    QVar53.m_data = (storage_type *)0x19;
    QVar53.m_size = (qsizetype)&local_7a8;
    QString::fromUtf8(QVar53);
    local_7a8.xo_text.d.size = (qsizetype)local_7a8.xo_text.d.ptr;
    pDVar8 = local_7a8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_7a8._4_4_,local_7a8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar54.m_data = psVar13;
    QVar54.m_size = (qsizetype)&local_7a8;
    QString::fromUtf8(QVar54);
    local_7a8.xo_value.d.size = (qsizetype)local_7a8.xo_text.d.ptr;
    local_7a8.xo_value.d.d = (Data *)CONCAT44(local_7a8._4_4_,local_7a8.xo_type);
    local_7a8.xo_type = tAttribute;
    local_7a8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_7a8.xo_value.d.ptr = (char16_t *)local_7a8.xo_text.d.d;
    local_7a8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_7a8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_7a8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7a8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_7a8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7a8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_7a8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_7a8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_7a8);
  iVar2 = *(int *)((long)__buf + 0x138);
  if (iVar2 == -1) {
    local_7e0.xo_type = tNothing;
    local_7e0.xo_text.d.d = (Data *)0x0;
    local_7e0.xo_text.d.ptr = (char16_t *)0x0;
    local_7e0.xo_text.d.size = 0;
    local_7e0.xo_value.d.d = (Data *)0x0;
    local_7e0.xo_value.d.ptr = (char16_t *)0x0;
    local_7e0.xo_value.d.size = 0;
  }
  else {
    QVar55.m_data = (storage_type *)0x1f;
    QVar55.m_size = (qsizetype)&local_7e0;
    QString::fromUtf8(QVar55);
    local_7e0.xo_text.d.size = (qsizetype)local_7e0.xo_text.d.ptr;
    pDVar8 = local_7e0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_7e0._4_4_,local_7e0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar56.m_data = psVar13;
    QVar56.m_size = (qsizetype)&local_7e0;
    QString::fromUtf8(QVar56);
    local_7e0.xo_value.d.size = (qsizetype)local_7e0.xo_text.d.ptr;
    local_7e0.xo_value.d.d = (Data *)CONCAT44(local_7e0._4_4_,local_7e0.xo_type);
    local_7e0.xo_type = tAttribute;
    local_7e0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_7e0.xo_value.d.ptr = (char16_t *)local_7e0.xo_text.d.d;
    local_7e0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_7e0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_7e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_7e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_7e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_7e0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_7e0);
  iVar2 = *(int *)((long)__buf + 0x13c);
  if (iVar2 == 3) {
    local_818.xo_type = tNothing;
    local_818.xo_text.d.d = (Data *)0x0;
    local_818.xo_text.d.ptr = (char16_t *)0x0;
    local_818.xo_text.d.size = 0;
    local_818.xo_value.d.d = (Data *)0x0;
    local_818.xo_value.d.ptr = (char16_t *)0x0;
    local_818.xo_value.d.size = 0;
  }
  else {
    QVar57.m_data = (storage_type *)0x17;
    QVar57.m_size = (qsizetype)&local_818;
    QString::fromUtf8(QVar57);
    pcVar9 = local_818.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_818._4_4_,local_818.xo_type);
    QString::number((int)&local_850,iVar2);
    local_818.xo_type = tAttribute;
    local_818.xo_text.d.ptr = (char16_t *)local_818.xo_text.d.d;
    local_818.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_818.xo_value.d.d = (Data *)CONCAT44(local_850._4_4_,local_850.xo_type);
    local_818.xo_value.d.ptr = (char16_t *)local_850.xo_text.d.d;
    local_818.xo_value.d.size = (qsizetype)local_850.xo_text.d.ptr;
    local_818.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_818.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_818.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_818.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_850._4_4_,local_850.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_850._4_4_,local_850.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_818);
  iVar2 = *(int *)((long)__buf + 0x140);
  if (iVar2 == -1) {
    local_850.xo_type = tNothing;
    local_850.xo_text.d.d = (Data *)0x0;
    local_850.xo_text.d.ptr = (char16_t *)0x0;
    local_850.xo_text.d.size = 0;
    local_850.xo_value.d.d = (Data *)0x0;
    local_850.xo_value.d.ptr = (char16_t *)0x0;
    local_850.xo_value.d.size = 0;
  }
  else {
    QVar58.m_data = &DAT_0000000c;
    QVar58.m_size = (qsizetype)&local_850;
    QString::fromUtf8(QVar58);
    local_850.xo_text.d.size = (qsizetype)local_850.xo_text.d.ptr;
    pDVar8 = local_850.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_850._4_4_,local_850.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar59.m_data = psVar13;
    QVar59.m_size = (qsizetype)&local_850;
    QString::fromUtf8(QVar59);
    local_850.xo_value.d.size = (qsizetype)local_850.xo_text.d.ptr;
    local_850.xo_value.d.d = (Data *)CONCAT44(local_850._4_4_,local_850.xo_type);
    local_850.xo_type = tAttribute;
    local_850.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_850.xo_value.d.ptr = (char16_t *)local_850.xo_text.d.d;
    local_850.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_850.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_850.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_850.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_850.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_850.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_850.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_850.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_850);
  iVar2 = *(int *)((long)__buf + 0x178);
  if (iVar2 == -1) {
    local_888.xo_type = tNothing;
    local_888.xo_text.d.d = (Data *)0x0;
    local_888.xo_text.d.ptr = (char16_t *)0x0;
    local_888.xo_text.d.size = 0;
    local_888.xo_value.d.d = (Data *)0x0;
    local_888.xo_value.d.ptr = (char16_t *)0x0;
    local_888.xo_value.d.size = 0;
  }
  else {
    QVar60.m_data = (storage_type *)0xe;
    QVar60.m_size = (qsizetype)&local_888;
    QString::fromUtf8(QVar60);
    local_888.xo_text.d.size = (qsizetype)local_888.xo_text.d.ptr;
    pDVar8 = local_888.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_888._4_4_,local_888.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar61.m_data = psVar13;
    QVar61.m_size = (qsizetype)&local_888;
    QString::fromUtf8(QVar61);
    local_888.xo_value.d.size = (qsizetype)local_888.xo_text.d.ptr;
    local_888.xo_value.d.d = (Data *)CONCAT44(local_888._4_4_,local_888.xo_type);
    local_888.xo_type = tAttribute;
    local_888.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_888.xo_value.d.ptr = (char16_t *)local_888.xo_text.d.d;
    local_888.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_888.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_888.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_888.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_888.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_888.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_888.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_888.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_888);
  if (*(long *)((long)__buf + 400) == 0) {
    local_8c0.xo_type = tNothing;
    local_8c0.xo_text.d.d = (Data *)0x0;
    local_8c0.xo_text.d.ptr = (char16_t *)0x0;
    local_8c0.xo_text.d.size = 0;
    local_8c0.xo_value.d.d = (Data *)0x0;
    local_8c0.xo_value.d.ptr = (char16_t *)0x0;
    local_8c0.xo_value.d.size = 0;
  }
  else {
    QVar62.m_data = (storage_type *)0xa;
    QVar62.m_size = (qsizetype)&local_8c0;
    QString::fromUtf8(QVar62);
    local_8c0.xo_text.d.size = (qsizetype)local_8c0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_8c0._4_4_,local_8c0.xo_type);
    local_8c0.xo_type = tAttribute;
    local_8c0.xo_text.d.ptr = (char16_t *)local_8c0.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8c0.xo_value.d.d = *(Data **)((long)__buf + 0x180);
    local_8c0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x188);
    local_8c0.xo_value.d.size = *(qsizetype *)((long)__buf + 400);
    if (&(local_8c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_8c0.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_8c0);
  iVar2 = *(int *)((long)__buf + 0x19c);
  if (iVar2 == -1) {
    local_8f8.xo_type = tNothing;
    local_8f8.xo_text.d.d = (Data *)0x0;
    local_8f8.xo_text.d.ptr = (char16_t *)0x0;
    local_8f8.xo_text.d.size = 0;
    local_8f8.xo_value.d.d = (Data *)0x0;
    local_8f8.xo_value.d.ptr = (char16_t *)0x0;
    local_8f8.xo_value.d.size = 0;
  }
  else {
    QVar63.m_data = (storage_type *)0x11;
    QVar63.m_size = (qsizetype)&local_8f8;
    QString::fromUtf8(QVar63);
    local_8f8.xo_text.d.size = (qsizetype)local_8f8.xo_text.d.ptr;
    pDVar8 = local_8f8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_8f8._4_4_,local_8f8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar64.m_data = psVar13;
    QVar64.m_size = (qsizetype)&local_8f8;
    QString::fromUtf8(QVar64);
    local_8f8.xo_value.d.size = (qsizetype)local_8f8.xo_text.d.ptr;
    local_8f8.xo_value.d.d = (Data *)CONCAT44(local_8f8._4_4_,local_8f8.xo_type);
    local_8f8.xo_type = tAttribute;
    local_8f8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8f8.xo_value.d.ptr = (char16_t *)local_8f8.xo_text.d.d;
    local_8f8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_8f8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_8f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_8f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_8f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_8f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_8f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_8f8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_8f8);
  iVar2 = *(int *)((long)__buf + 0x1a0);
  if (iVar2 == -1) {
    local_930.xo_type = tNothing;
    local_930.xo_text.d.d = (Data *)0x0;
    local_930.xo_text.d.ptr = (char16_t *)0x0;
    local_930.xo_text.d.size = 0;
    local_930.xo_value.d.d = (Data *)0x0;
    local_930.xo_value.d.ptr = (char16_t *)0x0;
    local_930.xo_value.d.size = 0;
  }
  else {
    QVar65.m_data = (storage_type *)0x6;
    QVar65.m_size = (qsizetype)&local_930;
    QString::fromUtf8(QVar65);
    local_930.xo_text.d.size = (qsizetype)local_930.xo_text.d.ptr;
    pDVar8 = local_930.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_930._4_4_,local_930.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar66.m_data = psVar13;
    QVar66.m_size = (qsizetype)&local_930;
    QString::fromUtf8(QVar66);
    local_930.xo_value.d.size = (qsizetype)local_930.xo_text.d.ptr;
    local_930.xo_value.d.d = (Data *)CONCAT44(local_930._4_4_,local_930.xo_type);
    local_930.xo_type = tAttribute;
    local_930.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_930.xo_value.d.ptr = (char16_t *)local_930.xo_text.d.d;
    local_930.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_930.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_930.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_930.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_930.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_930.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_930.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_930.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_930);
  iVar2 = *(int *)((long)__buf + 0x1a4);
  if (iVar2 == 5) {
    local_968.xo_type = tNothing;
    local_968.xo_text.d.d = (Data *)0x0;
    local_968.xo_text.d.ptr = (char16_t *)0x0;
    local_968.xo_text.d.size = 0;
    local_968.xo_value.d.d = (Data *)0x0;
    local_968.xo_value.d.ptr = (char16_t *)0x0;
    local_968.xo_value.d.size = 0;
  }
  else {
    QVar67.m_data = (storage_type *)0xd;
    QVar67.m_size = (qsizetype)&local_968;
    QString::fromUtf8(QVar67);
    pcVar9 = local_968.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_968._4_4_,local_968.xo_type);
    QString::number((int)&local_9a0,iVar2);
    local_968.xo_type = tAttribute;
    local_968.xo_text.d.ptr = (char16_t *)local_968.xo_text.d.d;
    local_968.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_968.xo_value.d.d = (Data *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
    local_968.xo_value.d.ptr = (char16_t *)local_9a0.xo_text.d.d;
    local_968.xo_value.d.size = (qsizetype)local_9a0.xo_text.d.ptr;
    local_968.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_968.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_968.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_968.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_968);
  iVar2 = *(int *)((long)__buf + 0x1a8);
  if (iVar2 == 0) {
    local_9a0.xo_type = tNothing;
    local_9a0.xo_text.d.d = (Data *)0x0;
    local_9a0.xo_text.d.ptr = (char16_t *)0x0;
    local_9a0.xo_text.d.size = 0;
    local_9a0.xo_value.d.d = (Data *)0x0;
    local_9a0.xo_value.d.ptr = (char16_t *)0x0;
    local_9a0.xo_value.d.size = 0;
  }
  else {
    QVar68.m_data = (storage_type *)0x14;
    QVar68.m_size = (qsizetype)&local_9a0;
    QString::fromUtf8(QVar68);
    pcVar9 = local_9a0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
    QString::number((int)&local_9d8,iVar2);
    local_9a0.xo_type = tAttribute;
    local_9a0.xo_text.d.ptr = (char16_t *)local_9a0.xo_text.d.d;
    local_9a0.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_9a0.xo_value.d.d = (Data *)CONCAT44(local_9d8._4_4_,local_9d8.xo_type);
    local_9a0.xo_value.d.ptr = (char16_t *)local_9d8.xo_text.d.d;
    local_9a0.xo_value.d.size = (qsizetype)local_9d8.xo_text.d.ptr;
    local_9a0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_9a0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_9a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_9a0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_9d8._4_4_,local_9d8.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_9d8._4_4_,local_9d8.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_9a0);
  iVar2 = *(int *)((long)__buf + 0x1ac);
  if (iVar2 == -1) {
    local_9d8.xo_type = tNothing;
    local_9d8.xo_text.d.d = (Data *)0x0;
    local_9d8.xo_text.d.ptr = (char16_t *)0x0;
    local_9d8.xo_text.d.size = 0;
    local_9d8.xo_value.d.d = (Data *)0x0;
    local_9d8.xo_value.d.ptr = (char16_t *)0x0;
    local_9d8.xo_value.d.size = 0;
  }
  else {
    QVar69.m_data = (storage_type *)0x1d;
    QVar69.m_size = (qsizetype)&local_9d8;
    QString::fromUtf8(QVar69);
    local_9d8.xo_text.d.size = (qsizetype)local_9d8.xo_text.d.ptr;
    pDVar8 = local_9d8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_9d8._4_4_,local_9d8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar70.m_data = psVar13;
    QVar70.m_size = (qsizetype)&local_9d8;
    QString::fromUtf8(QVar70);
    local_9d8.xo_value.d.size = (qsizetype)local_9d8.xo_text.d.ptr;
    local_9d8.xo_value.d.d = (Data *)CONCAT44(local_9d8._4_4_,local_9d8.xo_type);
    local_9d8.xo_type = tAttribute;
    local_9d8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_9d8.xo_value.d.ptr = (char16_t *)local_9d8.xo_text.d.d;
    local_9d8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_9d8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_9d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_9d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_9d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_9d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_9d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_9d8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_9d8);
  if (*(long *)((long)__buf + 0x1c0) == 0) {
    local_a10.xo_type = tNothing;
    local_a10.xo_text.d.d = (Data *)0x0;
    local_a10.xo_text.d.ptr = (char16_t *)0x0;
    local_a10.xo_text.d.size = 0;
    local_a10.xo_value.d.d = (Data *)0x0;
    local_a10.xo_value.d.ptr = (char16_t *)0x0;
    local_a10.xo_value.d.size = 0;
  }
  else {
    QVar71.m_data = (storage_type *)0xa;
    QVar71.m_size = (qsizetype)&local_a10;
    QString::fromUtf8(QVar71);
    local_a10.xo_text.d.size = (qsizetype)local_a10.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_a10._4_4_,local_a10.xo_type);
    local_a10.xo_type = tAttribute;
    local_a10.xo_text.d.ptr = (char16_t *)local_a10.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a10.xo_value.d.d = *(Data **)((long)__buf + 0x1b0);
    local_a10.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1b8);
    local_a10.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1c0);
    if (&(local_a10.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a10.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_a10);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_a48.xo_type = tNothing;
    local_a48.xo_text.d.d = (Data *)0x0;
    local_a48.xo_text.d.ptr = (char16_t *)0x0;
    local_a48.xo_text.d.size = 0;
    local_a48.xo_value.d.d = (Data *)0x0;
    local_a48.xo_value.d.ptr = (char16_t *)0x0;
    local_a48.xo_value.d.size = 0;
  }
  else {
    QVar72.m_data = (storage_type *)0x15;
    QVar72.m_size = (qsizetype)&local_a48;
    QString::fromUtf8(QVar72);
    local_a48.xo_text.d.size = (qsizetype)local_a48.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48.xo_type);
    local_a48.xo_type = tAttribute;
    local_a48.xo_text.d.ptr = (char16_t *)local_a48.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a48.xo_value.d.d = *(Data **)((long)__buf + 0x1c8);
    local_a48.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1d0);
    local_a48.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1d8);
    if (&(local_a48.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a48.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_a48);
  if (*(long *)((long)__buf + 0x1f0) == 0) {
    local_a80.xo_type = tNothing;
    local_a80.xo_text.d.d = (Data *)0x0;
    local_a80.xo_text.d.ptr = (char16_t *)0x0;
    local_a80.xo_text.d.size = 0;
    local_a80.xo_value.d.d = (Data *)0x0;
    local_a80.xo_value.d.ptr = (char16_t *)0x0;
    local_a80.xo_value.d.size = 0;
  }
  else {
    QVar73.m_data = (storage_type *)0x18;
    QVar73.m_size = (qsizetype)&local_a80;
    QString::fromUtf8(QVar73);
    local_a80.xo_text.d.size = (qsizetype)local_a80.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_a80._4_4_,local_a80.xo_type);
    local_a80.xo_type = tAttribute;
    local_a80.xo_text.d.ptr = (char16_t *)local_a80.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a80.xo_value.d.d = *(Data **)((long)__buf + 0x1e0);
    local_a80.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1e8);
    local_a80.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1f0);
    if (&(local_a80.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a80.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_a80);
  attrX(&local_ab8,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x1f8),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_ab8);
  lVar3 = *(long *)((long)__buf + 0x218);
  if (lVar3 == 0) {
    local_af0.xo_type = tNothing;
    local_af0.xo_text.d.d = (Data *)0x0;
    local_af0.xo_text.d.ptr = (char16_t *)0x0;
    local_af0.xo_text.d.size = 0;
    local_af0.xo_value.d.d = (Data *)0x0;
    local_af0.xo_value.d.ptr = (char16_t *)0x0;
    local_af0.xo_value.d.size = 0;
  }
  else {
    QVar74.m_data = (storage_type *)0x17;
    QVar74.m_size = (qsizetype)&local_af0;
    QString::fromUtf8(QVar74);
    local_af0.xo_text.d.size = (qsizetype)local_af0.xo_text.d.ptr;
    local_ef8 = (QArrayData *)CONCAT44(local_af0._4_4_,local_af0.xo_type);
    local_af0.xo_type = tAttribute;
    local_af0.xo_text.d.ptr = (char16_t *)local_af0.xo_text.d.d;
    if (local_ef8 != (QArrayData *)0x0) {
      LOCK();
      (local_ef8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_ef8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_af0.xo_value.d.d = *(Data **)((long)__buf + 0x210);
    local_af0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x218);
    local_af0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x220);
    local_af0.xo_text.d.d = (Data *)local_ef8;
    if (&(local_af0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_af0);
  iVar2 = *(int *)((long)__buf + 0x228);
  if (iVar2 == -1) {
    local_b28.xo_type = tNothing;
    local_b28.xo_text.d.d = (Data *)0x0;
    local_b28.xo_text.d.ptr = (char16_t *)0x0;
    local_b28.xo_text.d.size = 0;
    local_b28.xo_value.d.d = (Data *)0x0;
    local_b28.xo_value.d.ptr = (char16_t *)0x0;
    local_b28.xo_value.d.size = 0;
  }
  else {
    QVar75.m_data = (storage_type *)0xe;
    QVar75.m_size = (qsizetype)&local_b28;
    QString::fromUtf8(QVar75);
    pcVar9 = local_b28.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_b28._4_4_,local_b28.xo_type);
    QString::number((int)&local_b60,iVar2);
    local_b28.xo_type = tAttribute;
    local_b28.xo_text.d.ptr = (char16_t *)local_b28.xo_text.d.d;
    local_b28.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b28.xo_value.d.d = (Data *)CONCAT44(local_b60._4_4_,local_b60.xo_type);
    local_b28.xo_value.d.ptr = (char16_t *)local_b60.xo_text.d.d;
    local_b28.xo_value.d.size = (qsizetype)local_b60.xo_text.d.ptr;
    local_b28.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_b28.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_b28.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b28.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_b60._4_4_,local_b60.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_b60._4_4_,local_b60.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_b28);
  iVar2 = *(int *)((long)__buf + 0x22c);
  if (iVar2 == -1) {
    local_b60.xo_type = tNothing;
    local_b60.xo_text.d.d = (Data *)0x0;
    local_b60.xo_text.d.ptr = (char16_t *)0x0;
    local_b60.xo_text.d.size = 0;
    local_b60.xo_value.d.d = (Data *)0x0;
    local_b60.xo_value.d.ptr = (char16_t *)0x0;
    local_b60.xo_value.d.size = 0;
  }
  else {
    QVar76.m_data = (storage_type *)0xf;
    QVar76.m_size = (qsizetype)&local_b60;
    QString::fromUtf8(QVar76);
    local_b60.xo_text.d.size = (qsizetype)local_b60.xo_text.d.ptr;
    pDVar8 = local_b60.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_b60._4_4_,local_b60.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar77.m_data = psVar13;
    QVar77.m_size = (qsizetype)&local_b60;
    QString::fromUtf8(QVar77);
    local_b60.xo_value.d.size = (qsizetype)local_b60.xo_text.d.ptr;
    local_b60.xo_value.d.d = (Data *)CONCAT44(local_b60._4_4_,local_b60.xo_type);
    local_b60.xo_type = tAttribute;
    local_b60.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b60.xo_value.d.ptr = (char16_t *)local_b60.xo_text.d.d;
    local_b60.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_b60.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_b60.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b60.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_b60.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b60.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_b60.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_b60.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_b60);
  iVar2 = *(int *)((long)__buf + 0x230);
  if (iVar2 == -1) {
    local_b98.xo_type = tNothing;
    local_b98.xo_text.d.d = (Data *)0x0;
    local_b98.xo_text.d.ptr = (char16_t *)0x0;
    local_b98.xo_text.d.size = 0;
    local_b98.xo_value.d.d = (Data *)0x0;
    local_b98.xo_value.d.ptr = (char16_t *)0x0;
    local_b98.xo_value.d.size = 0;
  }
  else {
    QVar78.m_data = &DAT_0000000c;
    QVar78.m_size = (qsizetype)&local_b98;
    QString::fromUtf8(QVar78);
    local_b98.xo_text.d.size = (qsizetype)local_b98.xo_text.d.ptr;
    pDVar8 = local_b98.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_b98._4_4_,local_b98.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar79.m_data = psVar13;
    QVar79.m_size = (qsizetype)&local_b98;
    QString::fromUtf8(QVar79);
    local_b98.xo_value.d.size = (qsizetype)local_b98.xo_text.d.ptr;
    local_b98.xo_value.d.d = (Data *)CONCAT44(local_b98._4_4_,local_b98.xo_type);
    local_b98.xo_type = tAttribute;
    local_b98.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b98.xo_value.d.ptr = (char16_t *)local_b98.xo_text.d.d;
    local_b98.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_b98.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_b98.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b98.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_b98.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b98.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_b98.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_b98.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_b98);
  iVar2 = *(int *)((long)__buf + 0x234);
  if (iVar2 == -1) {
    local_bd0.xo_type = tNothing;
    local_bd0.xo_text.d.d = (Data *)0x0;
    local_bd0.xo_text.d.ptr = (char16_t *)0x0;
    local_bd0.xo_text.d.size = 0;
    local_bd0.xo_value.d.d = (Data *)0x0;
    local_bd0.xo_value.d.ptr = (char16_t *)0x0;
    local_bd0.xo_value.d.size = 0;
  }
  else {
    QVar80.m_data = (storage_type *)0x10;
    QVar80.m_size = (qsizetype)&local_bd0;
    QString::fromUtf8(QVar80);
    local_bd0.xo_text.d.size = (qsizetype)local_bd0.xo_text.d.ptr;
    pDVar8 = local_bd0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_bd0._4_4_,local_bd0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar81.m_data = psVar13;
    QVar81.m_size = (qsizetype)&local_bd0;
    QString::fromUtf8(QVar81);
    local_bd0.xo_value.d.size = (qsizetype)local_bd0.xo_text.d.ptr;
    local_bd0.xo_value.d.d = (Data *)CONCAT44(local_bd0._4_4_,local_bd0.xo_type);
    local_bd0.xo_type = tAttribute;
    local_bd0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_bd0.xo_value.d.ptr = (char16_t *)local_bd0.xo_text.d.d;
    local_bd0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_bd0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_bd0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_bd0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_bd0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_bd0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_bd0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_bd0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_bd0);
  iVar2 = *(int *)((long)__buf + 0x238);
  if (iVar2 == -1) {
    local_c08.xo_type = tNothing;
    local_c08.xo_text.d.d = (Data *)0x0;
    local_c08.xo_text.d.ptr = (char16_t *)0x0;
    local_c08.xo_text.d.size = 0;
    local_c08.xo_value.d.d = (Data *)0x0;
    local_c08.xo_value.d.ptr = (char16_t *)0x0;
    local_c08.xo_value.d.size = 0;
  }
  else {
    QVar82.m_data = (storage_type *)0xd;
    QVar82.m_size = (qsizetype)&local_c08;
    QString::fromUtf8(QVar82);
    local_c08.xo_text.d.size = (qsizetype)local_c08.xo_text.d.ptr;
    pDVar8 = local_c08.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_c08._4_4_,local_c08.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar83.m_data = psVar13;
    QVar83.m_size = (qsizetype)&local_c08;
    QString::fromUtf8(QVar83);
    local_c08.xo_value.d.size = (qsizetype)local_c08.xo_text.d.ptr;
    local_c08.xo_value.d.d = (Data *)CONCAT44(local_c08._4_4_,local_c08.xo_type);
    local_c08.xo_type = tAttribute;
    local_c08.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c08.xo_value.d.ptr = (char16_t *)local_c08.xo_text.d.d;
    local_c08.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_c08.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_c08.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_c08.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_c08.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_c08.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_c08.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_c08.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_c08);
  iVar2 = *(int *)((long)__buf + 0x23c);
  if (iVar2 == 0) {
    local_c40.xo_type = tNothing;
    local_c40.xo_text.d.d = (Data *)0x0;
    local_c40.xo_text.d.ptr = (char16_t *)0x0;
    local_c40.xo_text.d.size = 0;
    local_c40.xo_value.d.d = (Data *)0x0;
    local_c40.xo_value.d.ptr = (char16_t *)0x0;
    local_c40.xo_value.d.size = 0;
  }
  else {
    QVar84.m_data = (storage_type *)0x15;
    QVar84.m_size = (qsizetype)&local_c40;
    QString::fromUtf8(QVar84);
    pcVar9 = local_c40.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_c40._4_4_,local_c40.xo_type);
    QString::number((int)&local_c78,iVar2);
    local_c40.xo_type = tAttribute;
    local_c40.xo_text.d.ptr = (char16_t *)local_c40.xo_text.d.d;
    local_c40.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c40.xo_value.d.d = (Data *)CONCAT44(local_c78._4_4_,local_c78.xo_type);
    local_c40.xo_value.d.ptr = (char16_t *)local_c78.xo_text.d.d;
    local_c40.xo_value.d.size = (qsizetype)local_c78.xo_text.d.ptr;
    local_c40.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_c40.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_c40.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_c40.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_c78._4_4_,local_c78.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_c78._4_4_,local_c78.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_c40);
  iVar2 = *(int *)((long)__buf + 0x240);
  if (iVar2 == -1) {
    local_c78.xo_type = tNothing;
    local_c78.xo_text.d.d = (Data *)0x0;
    local_c78.xo_text.d.ptr = (char16_t *)0x0;
    local_c78.xo_text.d.size = 0;
    local_c78.xo_value.d.d = (Data *)0x0;
    local_c78.xo_value.d.ptr = (char16_t *)0x0;
    local_c78.xo_value.d.size = 0;
  }
  else {
    QVar85.m_data = (storage_type *)0x15;
    QVar85.m_size = (qsizetype)&local_c78;
    QString::fromUtf8(QVar85);
    local_c78.xo_text.d.size = (qsizetype)local_c78.xo_text.d.ptr;
    pDVar8 = local_c78.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_c78._4_4_,local_c78.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar86.m_data = psVar13;
    QVar86.m_size = (qsizetype)&local_c78;
    QString::fromUtf8(QVar86);
    local_c78.xo_value.d.size = (qsizetype)local_c78.xo_text.d.ptr;
    local_c78.xo_value.d.d = (Data *)CONCAT44(local_c78._4_4_,local_c78.xo_type);
    local_c78.xo_type = tAttribute;
    local_c78.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c78.xo_value.d.ptr = (char16_t *)local_c78.xo_text.d.d;
    local_c78.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_c78.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_c78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_c78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_c78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_c78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_c78.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_c78.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_c78);
  iVar2 = *(int *)((long)__buf + 0x244);
  if (iVar2 == -1) {
    local_cb0.xo_type = tNothing;
    local_cb0.xo_text.d.d = (Data *)0x0;
    local_cb0.xo_text.d.ptr = (char16_t *)0x0;
    local_cb0.xo_text.d.size = 0;
    local_cb0.xo_value.d.d = (Data *)0x0;
    local_cb0.xo_value.d.ptr = (char16_t *)0x0;
    local_cb0.xo_value.d.size = 0;
  }
  else {
    QVar87.m_data = (storage_type *)0x19;
    QVar87.m_size = (qsizetype)&local_cb0;
    QString::fromUtf8(QVar87);
    local_cb0.xo_text.d.size = (qsizetype)local_cb0.xo_text.d.ptr;
    pDVar8 = local_cb0.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_cb0._4_4_,local_cb0.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar88.m_data = psVar13;
    QVar88.m_size = (qsizetype)&local_cb0;
    QString::fromUtf8(QVar88);
    local_cb0.xo_value.d.size = (qsizetype)local_cb0.xo_text.d.ptr;
    local_cb0.xo_value.d.d = (Data *)CONCAT44(local_cb0._4_4_,local_cb0.xo_type);
    local_cb0.xo_type = tAttribute;
    local_cb0.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_cb0.xo_value.d.ptr = (char16_t *)local_cb0.xo_text.d.d;
    local_cb0.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_cb0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_cb0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cb0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_cb0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cb0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_cb0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_cb0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_cb0);
  iVar2 = *(int *)((long)__buf + 0x248);
  if (iVar2 == -1) {
    local_ce8.xo_type = tNothing;
    local_ce8.xo_text.d.d = (Data *)0x0;
    local_ce8.xo_text.d.ptr = (char16_t *)0x0;
    local_ce8.xo_text.d.size = 0;
    local_ce8.xo_value.d.d = (Data *)0x0;
    local_ce8.xo_value.d.ptr = (char16_t *)0x0;
    local_ce8.xo_value.d.size = 0;
  }
  else {
    QVar89.m_data = (storage_type *)0x19;
    QVar89.m_size = (qsizetype)&local_ce8;
    QString::fromUtf8(QVar89);
    local_ce8.xo_text.d.size = (qsizetype)local_ce8.xo_text.d.ptr;
    pDVar8 = local_ce8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_ce8._4_4_,local_ce8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar90.m_data = psVar13;
    QVar90.m_size = (qsizetype)&local_ce8;
    QString::fromUtf8(QVar90);
    local_ce8.xo_value.d.size = (qsizetype)local_ce8.xo_text.d.ptr;
    local_ce8.xo_value.d.d = (Data *)CONCAT44(local_ce8._4_4_,local_ce8.xo_type);
    local_ce8.xo_type = tAttribute;
    local_ce8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_ce8.xo_value.d.ptr = (char16_t *)local_ce8.xo_text.d.d;
    local_ce8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_ce8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_ce8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ce8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_ce8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ce8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_ce8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_ce8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_ce8);
  iVar2 = *(int *)((long)__buf + 0x24c);
  if (iVar2 == -1) {
    local_d20.xo_type = tNothing;
    local_d20.xo_text.d.d = (Data *)0x0;
    local_d20.xo_text.d.ptr = (char16_t *)0x0;
    local_d20.xo_text.d.size = 0;
    local_d20.xo_value.d.d = (Data *)0x0;
    local_d20.xo_value.d.ptr = (char16_t *)0x0;
    local_d20.xo_value.d.size = 0;
  }
  else {
    QVar91.m_data = (storage_type *)0x22;
    QVar91.m_size = (qsizetype)&local_d20;
    QString::fromUtf8(QVar91);
    local_d20.xo_text.d.size = (qsizetype)local_d20.xo_text.d.ptr;
    pDVar8 = local_d20.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_d20._4_4_,local_d20.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar92.m_data = psVar13;
    QVar92.m_size = (qsizetype)&local_d20;
    QString::fromUtf8(QVar92);
    local_d20.xo_value.d.size = (qsizetype)local_d20.xo_text.d.ptr;
    local_d20.xo_value.d.d = (Data *)CONCAT44(local_d20._4_4_,local_d20.xo_type);
    local_d20.xo_type = tAttribute;
    local_d20.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d20.xo_value.d.ptr = (char16_t *)local_d20.xo_text.d.d;
    local_d20.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_d20.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d20.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d20.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_d20.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d20.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_d20.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_d20.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_d20);
  attrX(&local_d58,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),",");
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_d58);
  iVar2 = *(int *)((long)__buf + 0x268);
  iVar12 = 0;
  if (iVar2 != 2) {
    iVar12 = iVar2;
  }
  iVar14 = 2;
  if (iVar12 != 3) {
    iVar14 = iVar12;
  }
  if (*(int *)(*(long *)((long)__buf + 0x318) + 4) < 0x80) {
    iVar14 = iVar2;
  }
  if (iVar14 == -1) {
    local_d90.xo_type = tNothing;
    local_d90.xo_text.d.d = (Data *)0x0;
    local_d90.xo_text.d.ptr = (char16_t *)0x0;
    local_d90.xo_text.d.size = 0;
    local_d90.xo_value.d.d = (Data *)0x0;
    local_d90.xo_value.d.ptr = (char16_t *)0x0;
    local_d90.xo_value.d.size = 0;
  }
  else {
    QVar93.m_data = (storage_type *)0x14;
    QVar93.m_size = (qsizetype)&local_d90;
    QString::fromUtf8(QVar93);
    pcVar9 = local_d90.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_d90._4_4_,local_d90.xo_type);
    QString::number((int)&local_dc8,iVar14);
    local_d90.xo_type = tAttribute;
    local_d90.xo_text.d.ptr = (char16_t *)local_d90.xo_text.d.d;
    local_d90.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d90.xo_value.d.d = (Data *)CONCAT44(local_dc8._4_4_,local_dc8.xo_type);
    local_d90.xo_value.d.ptr = (char16_t *)local_dc8.xo_text.d.d;
    local_d90.xo_value.d.size = (qsizetype)local_dc8.xo_text.d.ptr;
    local_d90.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_d90.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d90.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d90.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_dc8._4_4_,local_dc8.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_dc8._4_4_,local_dc8.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_d90);
  iVar2 = *(int *)((long)__buf + 0x288);
  if (iVar2 == -1) {
    local_dc8.xo_type = tNothing;
    local_dc8.xo_text.d.d = (Data *)0x0;
    local_dc8.xo_text.d.ptr = (char16_t *)0x0;
    local_dc8.xo_text.d.size = 0;
    local_dc8.xo_value.d.d = (Data *)0x0;
    local_dc8.xo_value.d.ptr = (char16_t *)0x0;
    local_dc8.xo_value.d.size = 0;
  }
  else {
    QVar94.m_data = (storage_type *)0xb;
    QVar94.m_size = (qsizetype)&local_dc8;
    QString::fromUtf8(QVar94);
    local_dc8.xo_text.d.size = (qsizetype)local_dc8.xo_text.d.ptr;
    pDVar8 = local_dc8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_dc8._4_4_,local_dc8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar95.m_data = psVar13;
    QVar95.m_size = (qsizetype)&local_dc8;
    QString::fromUtf8(QVar95);
    local_dc8.xo_value.d.size = (qsizetype)local_dc8.xo_text.d.ptr;
    local_dc8.xo_value.d.d = (Data *)CONCAT44(local_dc8._4_4_,local_dc8.xo_type);
    local_dc8.xo_type = tAttribute;
    local_dc8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_dc8.xo_value.d.ptr = (char16_t *)local_dc8.xo_text.d.d;
    local_dc8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_dc8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_dc8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_dc8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_dc8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_dc8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_dc8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_dc8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_dc8);
  iVar2 = *(int *)((long)__buf + 0x28c);
  if (iVar2 == -1) {
    local_e00.xo_type = tNothing;
    local_e00.xo_text.d.d = (Data *)0x0;
    local_e00.xo_text.d.ptr = (char16_t *)0x0;
    local_e00.xo_text.d.size = 0;
    local_e00.xo_value.d.d = (Data *)0x0;
    local_e00.xo_value.d.ptr = (char16_t *)0x0;
    local_e00.xo_value.d.size = 0;
  }
  else {
    QVar96.m_data = &DAT_0000000c;
    QVar96.m_size = (qsizetype)&local_e00;
    QString::fromUtf8(QVar96);
    pcVar9 = local_e00.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_e00._4_4_,local_e00.xo_type);
    QString::number((int)&local_e38,iVar2);
    local_e00.xo_type = tAttribute;
    local_e00.xo_text.d.ptr = (char16_t *)local_e00.xo_text.d.d;
    local_e00.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e00.xo_value.d.d = (Data *)CONCAT44(local_e38._4_4_,local_e38.xo_type);
    local_e00.xo_value.d.ptr = (char16_t *)local_e38.xo_text.d.d;
    local_e00.xo_value.d.size = (qsizetype)local_e38.xo_text.d.ptr;
    local_e00.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_e00.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e00.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e00.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_e38._4_4_,local_e38.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_e38._4_4_,local_e38.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_e00);
  iVar2 = *(int *)((long)__buf + 0x290);
  if (iVar2 == -1) {
    local_e38.xo_type = tNothing;
    local_e38.xo_text.d.d = (Data *)0x0;
    local_e38.xo_text.d.ptr = (char16_t *)0x0;
    local_e38.xo_text.d.size = 0;
    local_e38.xo_value.d.d = (Data *)0x0;
    local_e38.xo_value.d.ptr = (char16_t *)0x0;
    local_e38.xo_value.d.size = 0;
  }
  else {
    QVar97.m_data = (storage_type *)0x18;
    QVar97.m_size = (qsizetype)&local_e38;
    QString::fromUtf8(QVar97);
    local_e38.xo_text.d.size = (qsizetype)local_e38.xo_text.d.ptr;
    pDVar8 = local_e38.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_e38._4_4_,local_e38.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar98.m_data = psVar13;
    QVar98.m_size = (qsizetype)&local_e38;
    QString::fromUtf8(QVar98);
    local_e38.xo_value.d.size = (qsizetype)local_e38.xo_text.d.ptr;
    local_e38.xo_value.d.d = (Data *)CONCAT44(local_e38._4_4_,local_e38.xo_type);
    local_e38.xo_type = tAttribute;
    local_e38.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e38.xo_value.d.ptr = (char16_t *)local_e38.xo_text.d.d;
    local_e38.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_e38.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e38.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e38.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_e38.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e38.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_e38.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_e38.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_e38);
  iVar2 = *(int *)((long)__buf + 0x294);
  if (iVar2 == -1) {
    local_e70.xo_type = tNothing;
    local_e70.xo_text.d.d = (Data *)0x0;
    local_e70.xo_text.d.ptr = (char16_t *)0x0;
    local_e70.xo_text.d.size = 0;
    local_e70.xo_value.d.d = (Data *)0x0;
    local_e70.xo_value.d.ptr = (char16_t *)0x0;
    local_e70.xo_value.d.size = 0;
  }
  else {
    QVar99.m_data = (storage_type *)0x16;
    QVar99.m_size = (qsizetype)&local_e70;
    QString::fromUtf8(QVar99);
    pcVar9 = local_e70.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_e70._4_4_,local_e70.xo_type);
    QString::number((int)&local_ea8,iVar2);
    local_e70.xo_type = tAttribute;
    local_e70.xo_text.d.ptr = (char16_t *)local_e70.xo_text.d.d;
    local_e70.xo_text.d.size = (qsizetype)pcVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e70.xo_value.d.d = (Data *)CONCAT44(local_ea8._4_4_,local_ea8.xo_type);
    local_e70.xo_value.d.ptr = (char16_t *)local_ea8.xo_text.d.d;
    local_e70.xo_value.d.size = (qsizetype)local_ea8.xo_text.d.ptr;
    local_e70.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_e70.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e70.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e70.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar5 = (int *)CONCAT44(local_ea8._4_4_,local_ea8.xo_type);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_ea8._4_4_,local_ea8.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_e70);
  iVar2 = *(int *)((long)__buf + 0x298);
  if (iVar2 == -1) {
    local_ea8.xo_type = tNothing;
    local_ea8.xo_text.d.d = (Data *)0x0;
    local_ea8.xo_text.d.ptr = (char16_t *)0x0;
    local_ea8.xo_text.d.size = 0;
    local_ea8.xo_value.d.d = (Data *)0x0;
    local_ea8.xo_value.d.ptr = (char16_t *)0x0;
    local_ea8.xo_value.d.size = 0;
  }
  else {
    QVar100.m_data = (storage_type *)0xe;
    QVar100.m_size = (qsizetype)&local_ea8;
    QString::fromUtf8(QVar100);
    local_ea8.xo_text.d.size = (qsizetype)local_ea8.xo_text.d.ptr;
    pDVar8 = local_ea8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_ea8._4_4_,local_ea8.xo_type);
    pcVar11 = "false";
    if (iVar2 == 1) {
      pcVar11 = "true";
    }
    psVar13 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar13 + (long)(pcVar11 + 1);
      psVar13 = psVar13 + 1;
    } while (*pcVar1 != '\0');
    QVar101.m_data = psVar13;
    QVar101.m_size = (qsizetype)&local_ea8;
    QString::fromUtf8(QVar101);
    local_ea8.xo_value.d.size = (qsizetype)local_ea8.xo_text.d.ptr;
    local_ea8.xo_value.d.d = (Data *)CONCAT44(local_ea8._4_4_,local_ea8.xo_type);
    local_ea8.xo_type = tAttribute;
    local_ea8.xo_text.d.ptr = (char16_t *)pDVar8;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_ea8.xo_value.d.ptr = (char16_t *)local_ea8.xo_text.d.d;
    local_ea8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_ea8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_ea8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ea8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_ea8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ea8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_ea8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_ea8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar10 = XmlOutput::operator<<(pXVar10,&local_ea8);
  QVar102.m_data = (storage_type *)0x4;
  QVar102.m_size = (qsizetype)&local_ee0;
  QString::fromUtf8(QVar102);
  local_ee0.xo_text.d.size = (qsizetype)local_ee0.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_ee0._4_4_,local_ee0.xo_type);
  local_ee0.xo_type = tCloseTag;
  local_ee0.xo_text.d.ptr = (char16_t *)local_ee0.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_ee0.xo_value.d.d = (Data *)0x0;
  local_ee0.xo_value.d.ptr = (char16_t *)0x0;
  local_ee0.xo_value.d.size = 0;
  local_ee0.xo_text.d.d = (Data *)pQVar4;
  XmlOutput::operator<<(pXVar10,&local_ee0);
  if (&(local_ee0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ee0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ee0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ee0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (&(local_ea8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ea8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ea8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ea8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e38.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e38.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e38.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e38.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e00.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e00.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e00.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e00.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_dc8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_dc8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_dc8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_dc8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d90.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d90.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d58.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d58.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d58.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d58.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d20.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d20.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d20.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d20.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ce8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ce8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ce8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ce8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cb0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_cb0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cb0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_cb0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c40.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c40.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c40.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c40.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c08.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c08.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c08.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c08.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bd0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_bd0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bd0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_bd0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b98.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b98.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b98.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b98.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b60.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b60.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b60.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b60.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_af0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_af0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_af0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_af0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_af0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_ef8 != (QArrayData *)0x0 && lVar3 != 0) {
    LOCK();
    (local_ef8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_ef8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_ef8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_ef8,2,0x10);
    }
  }
  if (&(local_ab8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ab8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ab8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ab8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a80.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a80.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a80.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a80.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a48.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a48.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a48.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a48.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a10.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a10.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a10.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a10.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_9d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_9d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_9a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_9a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_968.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_968.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_968.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_968.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_930.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_930.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_930.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_930.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_888.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_888.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_888.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_888.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_850.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_850.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_850.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_850.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_818.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_818.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_818.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_818.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_770.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_770.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_770.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_770.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_738.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_738.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_738.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_738.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_700.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_700.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_700.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_700.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6c8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6c8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_690.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_690.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_690.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_690.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_658.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_658.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_658.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_658.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_620.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_620.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_620.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_620.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5e8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5e8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5b0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5b0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_578.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_578.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_578.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_578.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_540.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_540.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_540.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_540.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_508.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_508.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_508.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_508.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_498.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_498.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_498.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_498.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_460.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_460.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_460.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_460.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_428.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_428.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_428.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_428.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_380.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_380.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_348.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_348.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCCLCompilerTool)
        << attrX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories)
        << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
        << attrX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories)
        << attrS(_AssemblerListingLocation, tool.AssemblerListingLocation)
        << attrE(_AssemblerOutput, tool.AssemblerOutput, /*ifNot*/ asmListingNone)
        << attrE(_BasicRuntimeChecks, tool.BasicRuntimeChecks, /*ifNot*/ runtimeBasicCheckNone)
        << attrE(_BrowseInformation, tool.BrowseInformation, /*ifNot*/ brInfoNone)
        << attrS(_BrowseInformationFile, tool.BrowseInformationFile)
        << attrT(_BufferSecurityCheck, tool.BufferSecurityCheck)
        << attrE(_CallingConvention, tool.CallingConvention, /*ifNot*/ callConventionDefault)
        << attrE(_CompileAs, tool.CompileAs, compileAsDefault)
        << attrE(_CompileAsManaged, tool.CompileAsManaged, /*ifNot*/ managedDefault)
        << attrT(_CompileOnly, tool.CompileOnly)
        << attrE(_DebugInformationFormat, tool.DebugInformationFormat, /*ifNot*/ debugUnknown)
        << attrT(_Detect64BitPortabilityProblems, tool.Detect64BitPortabilityProblems)
        << attrT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
        << attrX(_DisableSpecificWarnings, tool.DisableSpecificWarnings)
        << attrE(_EnableEnhancedInstructionSet, tool.EnableEnhancedInstructionSet, /*ifnot*/ archNotSet)
        << attrT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
        << attrT(_EnableFunctionLevelLinking, tool.EnableFunctionLevelLinking)
        << attrT(_EnableIntrinsicFunctions, tool.EnableIntrinsicFunctions)
        << xformExceptionHandlingNET2005(tool.ExceptionHandling, tool.config->CompilerVersion)
        << attrT(_ExpandAttributedSource, tool.ExpandAttributedSource)
        << attrE(_FavorSizeOrSpeed, tool.FavorSizeOrSpeed, /*ifNot*/ favorNone)

        << attrE(_FloatingPointModel, tool.FloatingPointModel, /*ifNot*/ floatingPointNotSet)
        << attrT(_FloatingPointExceptions, tool.FloatingPointExceptions)

        << attrT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
        << attrX(_ForcedIncludeFiles, tool.ForcedIncludeFiles)
        << attrX(_ForcedUsingFiles, tool.ForcedUsingFiles)
        << attrE(_GeneratePreprocessedFile, tool.GeneratePreprocessedFile, /*ifNot*/ preprocessUnknown)
        << attrT(_GlobalOptimizations, tool.GlobalOptimizations)
        << attrT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
        << attrT(_ImproveFloatingPointConsistency, tool.ImproveFloatingPointConsistency)
        << attrE(_InlineFunctionExpansion, tool.InlineFunctionExpansion, /*ifNot*/ expandDefault)
        << attrT(_KeepComments, tool.KeepComments)
        << attrT(_MinimalRebuild, tool.MinimalRebuild)
        << attrS(_ObjectFile, tool.ObjectFile)
        << attrT(_OmitFramePointers, tool.OmitFramePointers)
        << attrT(_OpenMP, tool.OpenMP)
        << attrE(_Optimization, tool.Optimization, /*ifNot*/ optimizeDefault)
        << attrE(_OptimizeForProcessor, tool.OptimizeForProcessor, /*ifNot*/ procOptimizeBlended)
        << attrT(_OptimizeForWindowsApplication, tool.OptimizeForWindowsApplication)
        << attrS(_OutputFile, tool.OutputFile)
        << attrS(_PrecompiledHeaderFile, tool.PrecompiledHeaderFile)
        << attrS(_PrecompiledHeaderThrough, tool.PrecompiledHeaderThrough)
        << attrX(_PreprocessorDefinitions, tool.PreprocessorDefinitions)
        << (tool.ProgramDataBaseFileName.isNull() ? noxml() : attr(_ProgramDataBaseFileName, tool.ProgramDataBaseFileName))
        << attrE(_RuntimeLibrary, tool.RuntimeLibrary, /*ifNot*/ rtUnknown)
        << attrT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
        << attrT(_ShowIncludes, tool.ShowIncludes)
        << attrT(_SmallerTypeCheck, tool.SmallerTypeCheck)
        << attrT(_StringPooling, tool.StringPooling)
        << attrE(_StructMemberAlignment, tool.StructMemberAlignment, /*ifNot*/ alignNotSet)
        << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << attrT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
        << attrT(_TurnOffAssemblyGeneration, tool.TurnOffAssemblyGeneration)
        << attrT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
        << attrX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions)
        << xformUsePrecompiledHeaderForNET2005(tool.UsePrecompiledHeader, tool.config->CompilerVersion)
        << attrT(_WarnAsError, tool.WarnAsError)
        << attrE(_WarningLevel, tool.WarningLevel, /*ifNot*/ warningLevelUnknown)
        << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization)
        << attrE(_CompileForArchitecture, tool.CompileForArchitecture, /*ifNot*/ archUnknown)
        << attrT(_InterworkCalls, tool.InterworkCalls)

        << closetag(_Tool);
}